

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool array_array_container_xor(array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  int iVar2;
  uint64_t *puVar3;
  uint16_t *puVar4;
  ulong uVar5;
  array_container_t *paVar6;
  bitset_container_t *bits;
  int iVar7;
  long lVar8;
  
  iVar7 = src_2->cardinality + src_1->cardinality;
  if (iVar7 < 0x1001) {
    paVar6 = array_container_create_given_capacity(iVar7);
    *dst = paVar6;
    array_container_xor(src_1,src_2,paVar6);
  }
  else {
    bits = bitset_container_from_array(src_1);
    *dst = bits;
    iVar7 = src_1->cardinality;
    iVar2 = src_2->cardinality;
    if ((long)iVar2 != 0) {
      puVar3 = bits->words;
      puVar4 = src_2->array;
      lVar8 = 0;
      do {
        uVar1 = *(ushort *)((long)puVar4 + lVar8);
        uVar5 = puVar3[uVar1 >> 6];
        iVar7 = (iVar7 - ((int)(uVar5 >> ((byte)uVar1 & 0x3f)) * 2 & 2U)) + 1;
        puVar3[uVar1 >> 6] = uVar5 ^ 1L << ((ulong)uVar1 & 0x3f);
        lVar8 = lVar8 + 2;
      } while ((long)iVar2 * 2 != lVar8);
    }
    bits->cardinality = iVar7;
    if (0x1000 < iVar7) {
      return 0x1000 < iVar7;
    }
    paVar6 = array_container_from_bitset(bits);
    *dst = paVar6;
    (*global_memory_hook.aligned_free)(bits->words);
    (*global_memory_hook.free)(bits);
  }
  return false;
}

Assistant:

bool array_array_container_xor(const array_container_t *src_1,
                               const array_container_t *src_2,
                               container_t **dst) {
    int totalCardinality =
        src_1->cardinality + src_2->cardinality;  // upper bound
    if (totalCardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_create_given_capacity(totalCardinality);
        array_container_xor(src_1, src_2, CAST_array(*dst));
        return false;  // not a bitset
    }
    *dst = bitset_container_from_array(src_1);
    bool returnval = true;  // expect a bitset
    bitset_container_t *ourbitset = CAST_bitset(*dst);
    ourbitset->cardinality = (uint32_t)bitset_flip_list_withcard(
        ourbitset->words, src_1->cardinality, src_2->array, src_2->cardinality);
    if (ourbitset->cardinality <= DEFAULT_MAX_SIZE) {
        // need to convert!
        *dst = array_container_from_bitset(ourbitset);
        bitset_container_free(ourbitset);
        returnval = false;  // not going to be a bitset
    }

    return returnval;
}